

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O1

XrResult TestLayerInvalidInterfaceNegotiateLoaderApiLayerInterface
                   (XrNegotiateLoaderInfo *loaderInfo,char *layerName,
                   XrNegotiateApiLayerRequest *layerRequest)

{
  XrResult XVar1;
  
  XVar1 = XR_ERROR_INITIALIZATION_FAILED;
  if ((((((layerRequest != (XrNegotiateApiLayerRequest *)0x0 &&
           loaderInfo != (XrNegotiateLoaderInfo *)0x0) &&
         (loaderInfo->structType == XR_LOADER_INTERFACE_STRUCT_LOADER_INFO)) &&
        (loaderInfo->structVersion == 1)) &&
       ((loaderInfo->structSize == 0x28 &&
        (layerRequest->structType == XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST)))) &&
      ((layerRequest->structVersion == 1 &&
       ((layerRequest->structSize == 0x30 && (loaderInfo->minInterfaceVersion < 2)))))) &&
     ((loaderInfo->maxInterfaceVersion != 0 &&
      ((short)(loaderInfo->minApiVersion + 0xfffeffff00000000 >> 0x30) == -1)))) {
    layerRequest->layerInterfaceVersion = 0;
    layerRequest->layerApiVersion = 0x100000000;
    layerRequest->getInstanceProcAddr = LayerTestXrGetInstanceProcAddr;
    XVar1 = XR_SUCCESS;
  }
  return XVar1;
}

Assistant:

LAYER_EXPORT XRAPI_ATTR XrResult XRAPI_CALL TestLayerInvalidInterfaceNegotiateLoaderApiLayerInterface(
    const XrNegotiateLoaderInfo *loaderInfo, const char *layerName, XrNegotiateApiLayerRequest *layerRequest) {
    if (nullptr == loaderInfo || nullptr == layerRequest || loaderInfo->structType != XR_LOADER_INTERFACE_STRUCT_LOADER_INFO ||
        loaderInfo->structVersion != XR_LOADER_INFO_STRUCT_VERSION || loaderInfo->structSize != sizeof(XrNegotiateLoaderInfo) ||
        layerRequest->structType != XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST ||
        layerRequest->structVersion != XR_API_LAYER_INFO_STRUCT_VERSION ||
        layerRequest->structSize != sizeof(XrNegotiateApiLayerRequest) ||
        loaderInfo->minInterfaceVersion > XR_CURRENT_LOADER_API_LAYER_VERSION ||
        loaderInfo->maxInterfaceVersion < XR_CURRENT_LOADER_API_LAYER_VERSION ||
        loaderInfo->minApiVersion < XR_MAKE_VERSION(0, 1, 0) || loaderInfo->minApiVersion >= XR_MAKE_VERSION(1, 1, 0)) {
        return XR_ERROR_INITIALIZATION_FAILED;
    }
    (void)layerName;
    layerRequest->layerInterfaceVersion = 0;
    layerRequest->layerApiVersion = XR_MAKE_VERSION(0, 1, 0);
    layerRequest->getInstanceProcAddr = LayerTestXrGetInstanceProcAddr;

    return XR_SUCCESS;
}